

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_context.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::BindContext::CreateColumnReference
          (BindContext *this,string *catalog_name,string *schema_name,string *table_name,
          string *column_name,ColumnBindType bind_type)

{
  pointer pcVar1;
  size_t __n;
  value_type *__x;
  bool bVar2;
  int iVar3;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> this_00;
  LogicalIndex idx;
  TableBinding *pTVar4;
  undefined4 extraout_var;
  ColumnDefinition *this_01;
  reference pvVar5;
  pointer pCVar6;
  LogicalIndex table_binding;
  undefined4 in_register_0000008c;
  optional_ptr<duckdb::Binding,_true> binding;
  int in_stack_00000008;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  optional_ptr<duckdb::StandardEntry,_true> catalog_entry;
  BindingAlias alias;
  ErrorData error;
  optional_ptr<duckdb::Binding,_true> local_1c8;
  _Head_base<0UL,_duckdb::ColumnRefExpression_*,_false> local_1c0;
  TableCatalogEntry *local_1b8;
  pointer pbStack_1b0;
  pointer local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_198;
  BindContext *local_178;
  string local_170;
  string local_150;
  string local_130;
  BindingAlias local_110;
  undefined1 local_b0 [128];
  
  __x = (value_type *)CONCAT44(in_register_0000008c,bind_type);
  local_178 = (BindContext *)catalog_name;
  ErrorData::ErrorData((ErrorData *)local_b0);
  local_1b8 = (TableCatalogEntry *)0x0;
  pbStack_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  if (schema_name->_M_string_length != 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1b8,schema_name);
  }
  if (table_name->_M_string_length != 0) {
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_1b8,table_name);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8,column_name);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1b8,__x);
  pcVar1 = (schema_name->_M_dataplus)._M_p;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar1,pcVar1 + schema_name->_M_string_length);
  pcVar1 = (table_name->_M_dataplus)._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar1,pcVar1 + table_name->_M_string_length);
  pcVar1 = (column_name->_M_dataplus)._M_p;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar1,pcVar1 + column_name->_M_string_length);
  BindingAlias::BindingAlias(&local_110,&local_130,&local_150,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  this_00._M_head_impl = (ColumnRefExpression *)operator_new(0x50);
  local_198.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1b8;
  local_198.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_1b0;
  local_198.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1a8;
  local_1b8 = (TableCatalogEntry *)0x0;
  pbStack_1b0 = (pointer)0x0;
  local_1a8 = (pointer)0x0;
  ColumnRefExpression::ColumnRefExpression(this_00._M_head_impl,&local_198);
  local_1c0._M_head_impl = this_00._M_head_impl;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_198);
  local_1c8 = GetBinding(local_178,&local_110,__x,(ErrorData *)local_b0);
  if (local_1c8.ptr != (Binding *)0x0) {
    optional_ptr<duckdb::Binding,_true>::CheckValid(&local_1c8);
    idx.index = Binding::GetBindingIndex(local_1c8.ptr,__x);
    if (in_stack_00000008 == 0) {
      optional_ptr<duckdb::Binding,_true>::CheckValid(&local_1c8);
      if ((local_1c8.ptr)->binding_type == TABLE) {
        pTVar4 = Binding::Cast<duckdb::TableBinding>(local_1c8.ptr);
        iVar3 = (*(pTVar4->super_Binding)._vptr_Binding[4])(pTVar4);
        local_198.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar3);
        if ((TableCatalogEntry *)
            local_198.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (TableCatalogEntry *)0x0) {
          bVar2 = IsVirtualColumn(idx.index);
          if (!bVar2) {
            optional_ptr<duckdb::StandardEntry,_true>::CheckValid
                      ((optional_ptr<duckdb::StandardEntry,_true> *)&local_198);
            table_binding.index = idx.index;
            this_01 = TableCatalogEntry::GetColumn
                                ((TableCatalogEntry *)
                                 local_198.
                                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,idx);
            bVar2 = ColumnDefinition::Generated(this_01);
            if (bVar2) {
              optional_ptr<duckdb::Binding,_true>::CheckValid(&local_1c8);
              pTVar4 = Binding::Cast<duckdb::TableBinding>(local_1c8.ptr);
              ExpandGeneratedColumn(this,(TableBinding *)table_binding.index,(string *)pTVar4);
              (*((this_00._M_head_impl)->super_ParsedExpression).super_BaseExpression.
                _vptr_BaseExpression[1])(this_00._M_head_impl);
              goto LAB_00e1a8b1;
            }
          }
        }
      }
    }
    optional_ptr<duckdb::Binding,_true>::CheckValid(&local_1c8);
    if (idx.index <
        (ulong)((long)((local_1c8.ptr)->names).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)((local_1c8.ptr)->names).
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      optional_ptr<duckdb::Binding,_true>::CheckValid(&local_1c8);
      pvVar5 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&(local_1c8.ptr)->names,idx.index);
      __n = pvVar5->_M_string_length;
      if (__n == __x->_M_string_length) {
        if (__n != 0) {
          iVar3 = bcmp((pvVar5->_M_dataplus)._M_p,(__x->_M_dataplus)._M_p,__n);
          if (iVar3 != 0) goto LAB_00e1a86b;
        }
      }
      else {
LAB_00e1a86b:
        pCVar6 = unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ColumnRefExpression,_std::default_delete<duckdb::ColumnRefExpression>,_true>
                               *)&local_1c0);
        optional_ptr<duckdb::Binding,_true>::CheckValid(&local_1c8);
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ::operator[](&(local_1c8.ptr)->names,idx.index);
        ::std::__cxx11::string::_M_assign
                  ((string *)&(pCVar6->super_ParsedExpression).super_BaseExpression.alias);
        this_00._M_head_impl = local_1c0._M_head_impl;
      }
    }
  }
  local_1c0._M_head_impl = (ColumnRefExpression *)0x0;
  (this->cte_references)._M_h._M_buckets = (__buckets_ptr)this_00._M_head_impl;
LAB_00e1a8b1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.alias._M_dataplus._M_p != &local_110.alias.field_2) {
    operator_delete(local_110.alias._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.schema._M_dataplus._M_p != &local_110.schema.field_2) {
    operator_delete(local_110.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.catalog._M_dataplus._M_p != &local_110.catalog.field_2) {
    operator_delete(local_110.catalog._M_dataplus._M_p);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1b8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_b0 + 0x48));
  if ((undefined1 *)local_b0._40_8_ != local_b0 + 0x38) {
    operator_delete((void *)local_b0._40_8_);
  }
  if ((undefined1 *)local_b0._8_8_ != local_b0 + 0x18) {
    operator_delete((void *)local_b0._8_8_);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> BindContext::CreateColumnReference(const string &catalog_name, const string &schema_name,
                                                                const string &table_name, const string &column_name,
                                                                ColumnBindType bind_type) {
	ErrorData error;
	vector<string> names;
	if (!catalog_name.empty()) {
		names.push_back(catalog_name);
	}
	if (!schema_name.empty()) {
		names.push_back(schema_name);
	}
	names.push_back(table_name);
	names.push_back(column_name);

	BindingAlias alias(catalog_name, schema_name, table_name);
	auto result = make_uniq<ColumnRefExpression>(std::move(names));
	auto binding = GetBinding(alias, column_name, error);
	if (!binding) {
		return std::move(result);
	}
	auto column_index = binding->GetBindingIndex(column_name);
	if (bind_type == ColumnBindType::EXPAND_GENERATED_COLUMNS && ColumnIsGenerated(*binding, column_index)) {
		return ExpandGeneratedColumn(binding->Cast<TableBinding>(), column_name);
	} else if (column_index < binding->names.size() && binding->names[column_index] != column_name) {
		// because of case insensitivity in the binder we rename the column to the original name
		// as it appears in the binding itself
		result->SetAlias(binding->names[column_index]);
	}
	return std::move(result);
}